

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringalgorithms_p.h
# Opt level: O3

QByteArray *
QStringAlgorithms<const_QByteArray>::simplified_helper
          (QByteArray *__return_storage_ptr__,QByteArray *str)

{
  byte bVar1;
  Data *pDVar2;
  byte bVar3;
  char *pcVar4;
  qsizetype qVar5;
  byte *pbVar6;
  byte *pbVar7;
  long lVar8;
  byte *pbVar10;
  long in_FS_OFFSET;
  QByteArray local_58;
  long local_38;
  byte *pbVar9;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar8 = (str->d).size;
  if (lVar8 == 0) {
    pDVar2 = (str->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (str->d).ptr;
    (__return_storage_ptr__->d).size = 0;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    pbVar10 = (byte *)(str->d).ptr;
    pbVar9 = pbVar10 + lVar8;
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(&local_58,lVar8,Uninitialized);
    bVar3 = 1;
    pbVar7 = (byte *)local_58.d.ptr;
    do {
      while ((0x3f < *pbVar10 || ((1L << (*pbVar10 & 0x3f) & 0x100003e00U) == 0))) {
        if (pbVar10 == pbVar9) goto LAB_00305047;
        while( true ) {
          pbVar6 = pbVar7;
          bVar1 = *pbVar10;
          if ((bVar1 < 0x40) && ((1L << (bVar1 & 0x3f) & 0x100003e00U) != 0)) break;
          pbVar10 = pbVar10 + 1;
          *pbVar6 = bVar1;
          pbVar7 = pbVar6 + 1;
          if (pbVar10 == pbVar9) goto LAB_00305044;
        }
        bVar3 = bVar3 & bVar1 == 0x20;
        pbVar7 = pbVar6 + 1;
        *pbVar6 = 0x20;
        if (pbVar10 == pbVar9) {
LAB_00305044:
          pbVar7 = pbVar6 + 1;
          goto LAB_00305047;
        }
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar9);
LAB_00305047:
    pbVar9 = (byte *)local_58.d.ptr;
    if ((pbVar7 != (byte *)local_58.d.ptr) && (pbVar9 = pbVar7 + -1, pbVar7[-1] != 0x20)) {
      pbVar9 = pbVar7;
    }
    lVar8 = (long)pbVar9 - (long)local_58.d.ptr;
    if ((bool)(lVar8 == (str->d).size & bVar3)) {
      pDVar2 = (str->d).d;
      (__return_storage_ptr__->d).d = pDVar2;
      (__return_storage_ptr__->d).ptr = (str->d).ptr;
      (__return_storage_ptr__->d).size = lVar8;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      QByteArray::resize(&local_58,lVar8);
      qVar5 = local_58.d.size;
      pcVar4 = local_58.d.ptr;
      pDVar2 = local_58.d.d;
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (char *)0x0;
      (__return_storage_ptr__->d).d = pDVar2;
      (__return_storage_ptr__->d).ptr = pcVar4;
      local_58.d.size = 0;
      (__return_storage_ptr__->d).size = qVar5;
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static inline StringType simplified_helper(StringType &str)
    {
        if (str.isEmpty())
            return str;
        const Char *src = str.cbegin();
        const Char *end = str.cend();
        NakedStringType result = isConst || !str.isDetached() ?
                                     StringType(str.size(), Qt::Uninitialized) :
                                     std::move(str);

        Char *dst = const_cast<Char *>(result.cbegin());
        Char *ptr = dst;
        bool unmodified = true;
        while (true) {
            while (src != end && isSpace(*src))
                ++src;
            while (src != end && !isSpace(*src))
                *ptr++ = *src++;
            if (src == end)
                break;
            if (*src != QChar::Space)
                unmodified = false;
            *ptr++ = QChar::Space;
        }
        if (ptr != dst && ptr[-1] == QChar::Space)
            --ptr;

        qsizetype newlen = ptr - dst;
        if (isConst && newlen == str.size() && unmodified) {
            // nothing happened, return the original
            return str;
        }
        result.resize(newlen);
        return result;
    }